

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator1.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  List<Employee_*> *pLVar2;
  Employee *pEVar3;
  long lVar4;
  SkipListIterator<Employee_*> iterator;
  ReverseListIterator<Employee_*> backward;
  ListIterator<Employee_*> forward;
  
  pLVar2 = (List<Employee_*> *)operator_new(0x18);
  List<Employee_*>::List(pLVar2,200);
  pEVar3 = (Employee *)operator_new(1);
  lVar1 = pLVar2->_size;
  lVar4 = pLVar2->_count;
  if (lVar4 <= lVar1) {
    pLVar2->_items[lVar4] = pEVar3;
    lVar4 = lVar4 + 1;
    pLVar2->_count = lVar4;
  }
  pEVar3 = (Employee *)operator_new(1);
  if (lVar4 <= lVar1) {
    pLVar2->_items[lVar4] = pEVar3;
    lVar4 = lVar4 + 1;
    pLVar2->_count = lVar4;
  }
  pEVar3 = (Employee *)operator_new(1);
  if (lVar4 <= lVar1) {
    pLVar2->_items[lVar4] = pEVar3;
    lVar4 = lVar4 + 1;
    pLVar2->_count = lVar4;
  }
  forward.super_Iterator<Employee_*>._vptr_Iterator = (_func_int **)&PTR_First_00103cb8;
  forward._current = 0;
  backward.super_Iterator<Employee_*>._vptr_Iterator = (_func_int **)&PTR_First_00103d10;
  backward._current = lVar4 + -1;
  backward._list = pLVar2;
  forward._list = pLVar2;
  PrintEmployees(&forward.super_Iterator<Employee_*>);
  PrintEmployees(&backward.super_Iterator<Employee_*>);
  pLVar2 = (List<Employee_*> *)operator_new(0x18);
  SkipList<Employee_*>::SkipList((SkipList<Employee_*> *)pLVar2);
  pEVar3 = (Employee *)operator_new(1);
  lVar1 = pLVar2->_size;
  lVar4 = pLVar2->_count;
  if (lVar4 <= lVar1) {
    ((List<Employee_*> *)&pLVar2->_items)->_items[lVar4] = pEVar3;
    lVar4 = lVar4 + 1;
    pLVar2->_count = lVar4;
  }
  pEVar3 = (Employee *)operator_new(1);
  if (lVar4 <= lVar1) {
    ((List<Employee_*> *)&pLVar2->_items)->_items[lVar4] = pEVar3;
    lVar4 = lVar4 + 1;
    pLVar2->_count = lVar4;
  }
  pEVar3 = (Employee *)operator_new(1);
  if (lVar4 <= lVar1) {
    ((List<Employee_*> *)&pLVar2->_items)->_items[lVar4] = pEVar3;
    pLVar2->_count = lVar4 + 1;
  }
  iterator.super_ListIterator<Employee_*>._current = 0;
  iterator.super_ListIterator<Employee_*>.super_Iterator<Employee_*>._vptr_Iterator =
       (_func_int **)&PTR_First_00103d58;
  iterator.super_ListIterator<Employee_*>._list = pLVar2;
  PrintEmployees((Iterator<Employee_*> *)&iterator);
  return 0;
}

Assistant:

int main()
{
    // EXAMPLE 1: List

    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    ListIterator<Employee*> forward(employees);
    ReverseListIterator<Employee*> backward(employees);

    PrintEmployees(forward);
    PrintEmployees(backward);


    // EXAMPLE 2: SkipList

    SkipList<Employee*>* employees2;

    employees2 = new SkipList<Employee*>;
    employees2->Append(new Employee);
    employees2->Append(new Employee);
    employees2->Append(new Employee);

    SkipListIterator<Employee*> iterator(employees2);
    PrintEmployees(iterator);

}